

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O0

int main(void)

{
  ostream *poVar1;
  rep rVar2;
  duration<long,_std::ratio<1L,_1000L>_> local_48;
  duration<long,_std::ratio<1L,_1000L>_> local_40;
  duration<long,_std::ratio<1L,_1000L>_> local_38;
  duration<long,_std::ratio<1L,_1000L>_> local_30;
  duration<long,_std::ratio<1L,_1000000000L>_> local_28;
  duration t4;
  duration t3;
  duration t2;
  duration t1;
  
  test1<nrg::SyncExecutor>("SyncExecution");
  test1<nrg::AsyncExecutor<nrg::InstantExecution>>("Async-InstantExecution (default)");
  test1<nrg::AsyncExecutor<nrg::InstantExecution>>("Async-InstantExecution");
  test1<nrg::AsyncExecutor<nrg::TimedExecution>>("Async-TimedExecution");
  test1<nrg::AsyncExecutor<nrg::PrioExecution>>("Async-PrioExecution");
  testAsyncTimed();
  t2 = measure<nrg::SyncExecutor>("SyncExecution",2);
  t3 = measure<nrg::AsyncExecutor<nrg::InstantExecution>>("Async-InstantExecution",2);
  t4 = measure<nrg::AsyncExecutor<nrg::TimedExecution>>("Async-TimedExecution",2);
  local_28.__r = (rep)measure<nrg::AsyncExecutor<nrg::PrioExecution>>("Async-PrioExecution",2);
  poVar1 = std::operator<<((ostream *)&std::cout,"SynExecution: ");
  local_30.__r = (rep)std::chrono::
                      duration_cast<std::chrono::duration<long,std::ratio<1l,1000l>>,long,std::ratio<1l,1000000000l>>
                                (&t2);
  rVar2 = std::chrono::duration<long,_std::ratio<1L,_1000L>_>::count(&local_30);
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,rVar2);
  std::operator<<(poVar1," ms\n");
  poVar1 = std::operator<<((ostream *)&std::cout,"Async-InstantExecution: ");
  local_38.__r = (rep)std::chrono::
                      duration_cast<std::chrono::duration<long,std::ratio<1l,1000l>>,long,std::ratio<1l,1000000000l>>
                                (&t3);
  rVar2 = std::chrono::duration<long,_std::ratio<1L,_1000L>_>::count(&local_38);
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,rVar2);
  std::operator<<(poVar1," ms\n");
  poVar1 = std::operator<<((ostream *)&std::cout,"Async-TimedExecution: ");
  local_40.__r = (rep)std::chrono::
                      duration_cast<std::chrono::duration<long,std::ratio<1l,1000l>>,long,std::ratio<1l,1000000000l>>
                                (&t4);
  rVar2 = std::chrono::duration<long,_std::ratio<1L,_1000L>_>::count(&local_40);
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,rVar2);
  std::operator<<(poVar1," ms\n");
  poVar1 = std::operator<<((ostream *)&std::cout,"Async-PrioExecution: ");
  local_48.__r = (rep)std::chrono::
                      duration_cast<std::chrono::duration<long,std::ratio<1l,1000l>>,long,std::ratio<1l,1000000000l>>
                                (&local_28);
  rVar2 = std::chrono::duration<long,_std::ratio<1L,_1000L>_>::count(&local_48);
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,rVar2);
  std::operator<<(poVar1," ms\n");
  test<nrg::AsyncExecutor<nrg::TimedExecution>>();
  testTimed();
  return 0;
}

Assistant:

int main()
{
    test1<nrg::SyncExecutor>("SyncExecution");
    test1<nrg::AsyncExecutor<>>("Async-InstantExecution (default)");
    test1<nrg::AsyncExecutor<nrg::InstantExecution>>("Async-InstantExecution");
    test1<nrg::AsyncExecutor<nrg::TimedExecution>>("Async-TimedExecution");
    test1<nrg::AsyncExecutor<nrg::PrioExecution>>("Async-PrioExecution");

    testAsyncTimed();

    auto t1 = measure<nrg::SyncExecutor>("SyncExecution", 2);
    auto t2 = measure<nrg::AsyncExecutor<nrg::InstantExecution>>("Async-InstantExecution", 2);
    auto t3 = measure<nrg::AsyncExecutor<nrg::TimedExecution>>("Async-TimedExecution", 2);
    auto t4 = measure<nrg::AsyncExecutor<nrg::PrioExecution>>("Async-PrioExecution", 2);

    using namespace std::chrono;
    std::cout << "SynExecution: " << duration_cast<milliseconds>(t1).count() << " ms\n";
    std::cout << "Async-InstantExecution: " << duration_cast<milliseconds>(t2).count() << " ms\n";
    std::cout << "Async-TimedExecution: " << duration_cast<milliseconds>(t3).count() << " ms\n";
    std::cout << "Async-PrioExecution: " << duration_cast<milliseconds>(t4).count() << " ms\n";

    test<nrg::AsyncExecutor<nrg::TimedExecution>>();

    testTimed();
}